

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O2

bufsize_t __thiscall SecurityDirWrapper::getSize(SecurityDirWrapper *this)

{
  WIN_CERTIFICATE *pWVar1;
  bufsize_t bVar2;
  
  pWVar1 = getCert(this);
  if (pWVar1 == (WIN_CERTIFICATE *)0x0) {
    bVar2 = 0;
  }
  else if ((this->super_DataDirEntryWrapper).field_0x4c == '\x01') {
    bVar2 = (bufsize_t)pWVar1->dwLength;
  }
  else {
    bVar2 = 0xc;
  }
  return bVar2;
}

Assistant:

bufsize_t SecurityDirWrapper::getSize()
{
    pe::WIN_CERTIFICATE* cert = getCert();
    if (cert == NULL) return 0;

    bufsize_t fullSize = static_cast<bufsize_t>(sizeof(pe::WIN_CERTIFICATE)); // TODO: check it
    if (this->sizeOk) {
        fullSize = static_cast<bufsize_t>(cert->dwLength);
    }
    return fullSize;
}